

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O1

void __thiscall
EDLines::EDLines(EDLines *this,Mat *srcImage,double _line_error,int _min_line_len,
                double _max_distance_between_two_lines,double _max_error)

{
  undefined8 *puVar1;
  uint uVar2;
  pointer pLVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  pointer *ppPVar8;
  double *x;
  double *y;
  pointer pvVar9;
  NFALUT *pNVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> segment;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,srcImage);
  ED::ED(&this->super_ED,local_90,SOBEL_OPERATOR,0x24,8,1,10,1.0,true);
  cv::Mat::~Mat(local_90);
  (this->linePoints).super__Vector_base<LS,_std::allocator<LS>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->linePoints).super__Vector_base<LS,_std::allocator<LS>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->invalidLines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->invalidLines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->invalidLines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->linePoints).super__Vector_base<LS,_std::allocator<LS>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->min_line_len = _min_line_len;
  this->line_error = _line_error;
  this->max_distance_between_two_lines = _max_distance_between_two_lines;
  this->max_error = _max_error;
  if (_min_line_len == -1) {
    iVar6 = ComputeMinLineLength(this);
    this->min_line_len = iVar6;
  }
  if (this->min_line_len < 9) {
    this->min_line_len = 9;
  }
  uVar13 = ((long)(this->super_ED).height + (long)(this->super_ED).width) * 8;
  pvVar9 = (this->super_ED).segmentPoints.
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar12 = (long)(this->super_ED).segmentPoints.
                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9;
  if (lVar12 != 0) {
    lVar12 = (lVar12 >> 3) * -0x5555555555555555;
    lVar12 = lVar12 + (ulong)(lVar12 == 0);
    ppPVar8 = (pointer *)
              ((long)&(pvVar9->
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                      _M_impl.super__Vector_impl_data + 8);
    do {
      uVar14 = (long)*ppPVar8 - (long)((_Vector_impl_data *)(ppPVar8 + -1))->_M_start >> 3;
      if (uVar14 < uVar13) {
        uVar14 = uVar13;
      }
      uVar13 = uVar14;
      ppPVar8 = ppPVar8 + 3;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  uVar13 = -(ulong)(uVar13 >> 0x3d != 0) | uVar13 << 3;
  x = (double *)operator_new__(uVar13);
  y = (double *)operator_new__(uVar13);
  this->linesNo = 0;
  pvVar9 = (this->super_ED).segmentPoints.
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_ED).segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar9) {
    uVar13 = 0;
    do {
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                (&segment,pvVar9 + uVar13);
      lVar12 = (long)segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      if (segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar15 = 0;
        do {
          x[lVar15] = (double)segment.
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar15].x;
          y[lVar15] = (double)segment.
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar15].y;
          lVar15 = lVar15 + 1;
        } while (lVar12 + (ulong)(lVar12 == 0) != lVar15);
      }
      SplitSegment2Lines(this,x,y,(int)lVar12,(int)uVar13);
      if (segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(segment.
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      uVar13 = uVar13 + 1;
      pvVar9 = (this->super_ED).segmentPoints.
               super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((long)(this->super_ED).segmentPoints.
                      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9 >> 3) *
               -0x5555555555555555;
    } while (uVar13 <= uVar14 && uVar14 - uVar13 != 0);
  }
  JoinCollinearLines(this);
  this->prec = 0.39269908169872414;
  dVar4 = log10((double)(this->super_ED).width);
  dVar5 = log10((double)(this->super_ED).height);
  iVar6 = (this->super_ED).width;
  iVar11 = (this->super_ED).height;
  pNVar10 = (NFALUT *)operator_new(0x20);
  iVar7 = iVar11 + iVar6;
  iVar6 = iVar11 + 7 + iVar6;
  if (-1 < iVar7) {
    iVar6 = iVar7;
  }
  NFALUT::NFALUT(pNVar10,iVar6 >> 3,0.125,dVar4 + dVar5 + dVar4 + dVar5);
  this->nfa = pNVar10;
  ValidateLineSegments(this);
  iVar6 = (int)((ulong)((long)(this->lines).
                              super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->lines).
                             super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  iVar11 = iVar6 * 0x38e38e39;
  uVar2 = this->linesNo;
  if (SBORROW4(uVar2,iVar11) != (int)(uVar2 + iVar6 * -0x38e38e39) < 0) {
    (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
         super__Vector_impl_data._M_finish + (-1 - (ulong)(~uVar2 + iVar11));
  }
  if (0 < this->linesNo) {
    lVar12 = 0x30;
    lVar15 = 0;
    do {
      pLVar3 = (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)((long)pLVar3 + lVar12 + -0x18);
      segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*puVar1;
      segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)puVar1[1];
      segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)((long)pLVar3 + lVar12 + -8);
      std::vector<LS,_std::allocator<LS>_>::emplace_back<LS>(&this->linePoints,(LS *)&segment);
      lVar15 = lVar15 + 1;
      lVar12 = lVar12 + 0x48;
    } while (lVar15 < this->linesNo);
  }
  operator_delete__(x);
  operator_delete__(y);
  pNVar10 = this->nfa;
  if (pNVar10 != (NFALUT *)0x0) {
    NFALUT::~NFALUT(pNVar10);
    operator_delete(pNVar10);
  }
  return;
}

Assistant:

EDLines::EDLines(Mat srcImage ,  double _line_error, int _min_line_len, double _max_distance_between_two_lines , double _max_error)
	:ED(srcImage, SOBEL_OPERATOR, 36, 8) 
{
	min_line_len = _min_line_len;
	line_error = _line_error;
	max_distance_between_two_lines = _max_distance_between_two_lines;
	max_error = _max_error;

	if(min_line_len == -1) // If no initial value given, compute it 
		min_line_len = ComputeMinLineLength();

	if (min_line_len < 9) // avoids small line segments in the result. Might be deleted!
		min_line_len = 9;



	// Temporary buffers used during line fitting
	size_t buffer_size = (width + height) * 8;
	for (int segmentNumber = 0; segmentNumber < segmentPoints.size(); segmentNumber++) {
		auto segment_size = segmentPoints[segmentNumber].size();
		buffer_size = std::max(buffer_size, segment_size);
	}
	double* x = new double[buffer_size];
	double* y = new double[buffer_size];

	linesNo = 0;
	
	// Use the whole segment
	for (int segmentNumber = 0; segmentNumber < segmentPoints.size(); segmentNumber++) {
		int k = 0;
		std::vector<Point> segment = segmentPoints[segmentNumber];
		for (int k = 0; k < segment.size(); k++) {
			x[k] = segment[k].x;
			y[k] = segment[k].y;
		}
		SplitSegment2Lines(x, y, (int)segment.size(), segmentNumber);
	}

	/*----------- JOIN COLLINEAR LINES ----------------*/
	JoinCollinearLines();

	/*----------- VALIDATE LINES ----------------*/
#define PRECISON_ANGLE 22.5 
	prec = (PRECISON_ANGLE / 180)*M_PI;
	double prob = 0.125;
#undef PRECISON_ANGLE

	double logNT = 2.0*(log10((double)width) + log10((double)height));

	int lutSize = (width + height) / 8;
	nfa = new NFALUT(lutSize, prob, logNT); // create look up table
	
	ValidateLineSegments();

	// Delete redundant space from lines
	// Pop them back
	int size = (int)lines.size();
	for (int i = 1; i <= size - linesNo; i++)
		lines.pop_back();
	
	for (int i = 0; i<linesNo; i++) {
		Point2d start(lines[i].sx, lines[i].sy);
		Point2d end(lines[i].ex, lines[i].ey);
		
		linePoints.push_back(LS(start, end));
	} //end-for

	delete[] x;
	delete[] y;
	delete nfa;
}